

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCopyLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  __type _Var2;
  Type *__lhs;
  Type *__rhs;
  string err;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  __lhs = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(layer->input_).super_RepeatedPtrFieldBase,0);
  __rhs = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(layer->output_).super_RepeatedPtrFieldBase,0);
  _Var2 = std::operator==(__lhs,__rhs);
  if (_Var2) {
    std::operator+(&local_38,"Copy layer \'",(layer->name_).ptr_);
    std::operator+(&err,&local_38,"\' has identical input and output names.");
    std::__cxx11::string::~string((string *)&local_38);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    Result::Result(__return_storage_ptr__,&r);
  }
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCopyLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (layer.input(0) == layer.output(0)) {
        const std::string err = "Copy layer '" + layer.name() + "' has identical input and output names.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}